

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall
FTypeTable::AddType(FTypeTable *this,PType *type,PClass *metatype,intptr_t parm1,intptr_t parm2,
                   size_t bucket)

{
  int iVar1;
  size_t in_RAX;
  undefined4 extraout_var;
  PType *pPVar2;
  size_t bucketcheck;
  size_t local_38;
  
  local_38 = in_RAX;
  if ((type->super_DObject).Class == (PClass *)0x0) {
    iVar1 = (**(type->super_DObject)._vptr_DObject)(type);
    (type->super_DObject).Class = (PClass *)CONCAT44(extraout_var,iVar1);
  }
  if ((PClass *)
      (type->super_DObject).Class[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
      super_DObject._vptr_DObject != metatype) {
    __assert_fail("metatype == type->GetClass()->TypeTableType && \"Metatype does not match passed object\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                  ,0xd94,"void FTypeTable::AddType(PType *, PClass *, intptr_t, intptr_t, size_t)");
  }
  pPVar2 = FindType(this,metatype,parm1,parm2,&local_38);
  if (pPVar2 != (PType *)0x0) {
    __assert_fail("FindType(metatype, parm1, parm2, &bucketcheck) == NULL && \"Type must not be inserted more than once\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                  ,0xd95,"void FTypeTable::AddType(PType *, PClass *, intptr_t, intptr_t, size_t)");
  }
  if (local_38 == bucket) {
    type->HashNext = this->TypeHash[bucket];
    this->TypeHash[bucket] = type;
    if (((type != (PType *)0x0) && (GC::State == 1)) &&
       (((type->super_DObject).ObjectFlags & 3) != 0)) {
      GC::Barrier((DObject *)0x0,&type->super_DObject);
    }
    return;
  }
  __assert_fail("bucketcheck == bucket && \"Passed bucket was wrong\"",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                ,0xd96,"void FTypeTable::AddType(PType *, PClass *, intptr_t, intptr_t, size_t)");
}

Assistant:

void FTypeTable::AddType(PType *type, PClass *metatype, intptr_t parm1, intptr_t parm2, size_t bucket)
{
#ifdef _DEBUG
	size_t bucketcheck;
	assert(metatype == type->GetClass()->TypeTableType && "Metatype does not match passed object");
	assert(FindType(metatype, parm1, parm2, &bucketcheck) == NULL && "Type must not be inserted more than once");
	assert(bucketcheck == bucket && "Passed bucket was wrong");
#endif
	type->HashNext = TypeHash[bucket];
	TypeHash[bucket] = type;
	GC::WriteBarrier(type);
}